

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3FindInIndex(Parse *pParse,Expr *pX,u32 inFlags,int *prRhsHasNull,int *aiMap,int *piTab)

{
  ushort uVar1;
  short sVar2;
  u32 uVar3;
  ExprList *pEVar4;
  Table *pTab;
  Schema *pSVar5;
  Vdbe *pVVar6;
  i16 *piVar7;
  SrcList *pSVar8;
  u8 uVar9;
  char cVar10;
  byte bVar11;
  char cVar12;
  int iVar13;
  int iVar14;
  int addr;
  Select *pSVar15;
  KeyInfo *pKVar16;
  CollSeq *pCVar17;
  Expr *pEVar18;
  Expr *pEVar19;
  int iVar20;
  Schema **ppSVar21;
  char *pcVar22;
  Op *pOVar23;
  long lVar24;
  uint uVar25;
  long lVar26;
  ExprList_item *pEVar27;
  int *piVar28;
  int iVar29;
  u16 *puVar30;
  SrcList **ppSVar31;
  Op *pOVar32;
  ulong uVar33;
  bool bVar34;
  SelectDest dest;
  Index *local_d0;
  char local_c1;
  KeyInfo *local_c0;
  ulong local_b8;
  Expr *local_b0;
  Expr *local_a8;
  int *local_a0;
  undefined8 local_98;
  Parse *local_90;
  int local_84;
  Vdbe *local_80;
  int *local_78;
  ulong local_70;
  Walker local_68;
  int *local_38;
  
  local_b8 = (ulong)(uint)pParse->nTab;
  pParse->nTab = pParse->nTab + 1;
  local_78 = aiMap;
  local_38 = piTab;
  local_80 = sqlite3GetVdbe(pParse);
  iVar20 = 0;
  if (prRhsHasNull == (int *)0x0) {
    local_a0 = (int *)0x0;
  }
  else {
    local_a0 = prRhsHasNull;
    if ((pX->flags & 0x800) != 0) {
      pEVar4 = ((pX->x).pSelect)->pEList;
      uVar25 = pEVar4->nExpr;
      local_a0 = prRhsHasNull;
      if ((int)uVar25 < 1) {
        uVar33 = 0;
      }
      else {
        pEVar27 = pEVar4->a;
        uVar33 = 0;
        do {
          iVar13 = sqlite3ExprCanBeNull(pEVar27->pExpr);
          if (iVar13 != 0) goto LAB_001842df;
          uVar33 = uVar33 + 1;
          pEVar27 = pEVar27 + 1;
        } while (uVar25 != uVar33);
        uVar33 = (ulong)uVar25;
      }
LAB_001842df:
      if ((uint)uVar33 == uVar25) {
        local_a0 = (int *)0x0;
      }
    }
  }
  if (pParse->nErr == 0) {
    iVar20 = 0;
    if (((((((pX->flags & 0x820) == 0x800) &&
           (pSVar15 = (pX->x).pSelect, pSVar15->pPrior == (Select *)0x0)) &&
          ((pSVar15->selFlags & 9) == 0)) &&
         ((pSVar15->pLimit == (Expr *)0x0 && (pSVar15->pWhere == (Expr *)0x0)))) &&
        (pSVar8 = pSVar15->pSrc, pSVar8->nSrc == 1)) &&
       ((pSVar8->a[0].pSelect == (Select *)0x0 && ((pSVar8->a[0].pTab)->nModuleArg == 0)))) {
      lVar24 = (long)pSVar15->pEList->nExpr;
      if (0 < lVar24) {
        lVar26 = 0;
        do {
          if (**(char **)((long)&pSVar15->pEList->a[0].pExpr + lVar26) != -0x5e) goto LAB_00184408;
          lVar26 = lVar26 + 0x20;
        } while (lVar24 * 0x20 != lVar26);
      }
    }
    else {
LAB_00184408:
      pSVar15 = (Select *)0x0;
    }
    if (pSVar15 != (Select *)0x0) {
      local_c0 = (KeyInfo *)pSVar15->pEList;
      uVar25 = local_c0->nRef;
      local_98 = (long)(int)uVar25;
      pTab = pSVar15->pSrc->a[0].pTab;
      if (pTab->pSchema == (Schema *)0x0) {
        iVar20 = -0x4240;
      }
      else {
        iVar20 = -0x10000;
        ppSVar21 = &pParse->db->aDb->pSchema;
        do {
          iVar20 = iVar20 + 0x10000;
          pSVar5 = *ppSVar21;
          ppSVar21 = ppSVar21 + 4;
        } while (pSVar5 != pTab->pSchema);
        iVar20 = iVar20 >> 0x10;
      }
      sqlite3CodeVerifySchema(pParse,iVar20);
      local_84 = iVar20;
      sqlite3TableLock(pParse,iVar20,pTab->tnum,'\0',pTab->zName);
      pVVar6 = local_80;
      if ((uVar25 == 1) && (*(short *)(*(long *)&local_c0->nAllField + 0x30) < 0)) {
        iVar20 = sqlite3VdbeAddOp3(local_80,0x11,0,0,0);
        sqlite3OpenTable(pParse,(int)local_b8,local_84,pTab,0x6c);
        sqlite3VdbeExplain(pParse,'\0',"USING ROWID SEARCH ON TABLE %s FOR IN-OPERATOR",pTab->zName)
        ;
        if (pVVar6->db->mallocFailed == '\0') {
          iVar13 = pVVar6->nOp + -1;
          if (-1 < iVar20) {
            iVar13 = iVar20;
          }
          pOVar23 = pVVar6->aOp + iVar13;
        }
        else {
          pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar23->p2 = pVVar6->nOp;
        iVar20 = 1;
      }
      else {
        local_90 = pParse;
        if ((int)uVar25 < 1) {
LAB_0018476c:
          local_d0 = pTab->pIndex;
          if (local_d0 != (Index *)0x0) {
            local_70 = -1L << ((byte)uVar25 & 0x3f);
            local_c0 = (KeyInfo *)&local_c0->nAllField;
            pParse = local_90;
            local_b0 = pX;
            do {
              uVar1 = local_d0->nColumn;
              iVar20 = 0;
              if (((((int)uVar25 <= (int)(uint)uVar1) && (iVar20 = 0, uVar1 < 0x3f)) &&
                  (iVar20 = 0, local_d0->pPartIdxWhere == (Expr *)0x0)) &&
                 (((inFlags & 4) == 0 ||
                  ((iVar20 = 0, (int)(uint)local_d0->nKeyCol <= (int)uVar25 &&
                   (((int)(uint)uVar1 <= (int)local_98 || (iVar20 = 0, local_d0->onError != '\0'))))
                  )))) {
                if ((int)uVar25 < 1) {
                  pEVar18 = (Expr *)0x0;
                }
                else {
                  lVar24 = 0;
                  pEVar18 = (Expr *)0x0;
                  do {
                    local_a8 = pEVar18;
                    pEVar19 = sqlite3VectorFieldSubexpr(pX->pLeft,(int)lVar24);
                    pEVar18 = (Expr *)local_c0->aColl[lVar24 * 4 + -4];
                    pCVar17 = sqlite3BinaryCompareCollSeq(pParse,pEVar19,pEVar18);
                    piVar7 = local_d0->aiColumn;
                    sVar2 = pEVar18->iColumn;
                    uVar33 = 0;
                    do {
                      if ((piVar7[uVar33] == sVar2) &&
                         ((pCVar17 == (CollSeq *)0x0 ||
                          (iVar20 = sqlite3StrICmp(pCVar17->zName,local_d0->azColl[uVar33]),
                          iVar20 == 0)))) goto LAB_00184876;
                      uVar33 = uVar33 + 1;
                    } while (uVar25 != uVar33);
                    uVar33 = (ulong)uVar25;
LAB_00184876:
                    if (((uint)uVar33 == uVar25) || (((ulong)local_a8 >> (uVar33 & 0x3f) & 1) != 0))
                    {
                      bVar34 = false;
                      pEVar18 = local_a8;
                    }
                    else {
                      pEVar18 = (Expr *)((ulong)local_a8 | 1L << ((byte)uVar33 & 0x3f));
                      bVar34 = true;
                      if (local_78 != (int *)0x0) {
                        local_78[lVar24] = (uint)uVar33;
                      }
                    }
                    pX = local_b0;
                    pParse = local_90;
                  } while ((bVar34) && (lVar24 = lVar24 + 1, lVar24 < local_98));
                }
                pVVar6 = local_80;
                iVar20 = 0;
                if (((ulong)pEVar18 ^ local_70) == 0xffffffffffffffff) {
                  iVar20 = sqlite3VdbeAddOp3(local_80,0x11,0,0,0);
                  sqlite3VdbeExplain(pParse,'\0',"USING INDEX %s FOR IN-OPERATOR",local_d0->zName);
                  sqlite3VdbeAddOp3(pVVar6,0x6c,(int)local_b8,local_d0->tnum,local_84);
                  sqlite3VdbeSetP4KeyInfo(pParse,local_d0);
                  bVar11 = *local_d0->aSortOrder;
                  if (local_a0 != (int *)0x0) {
                    iVar13 = pParse->nMem + 1;
                    pParse->nMem = iVar13;
                    *local_a0 = iVar13;
                    if ((int)local_98 == 1) {
                      sqlite3SetHasNullFlag(pVVar6,(int)local_b8,iVar13);
                    }
                  }
                  pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
                  if (pVVar6->db->mallocFailed == '\0') {
                    iVar13 = pVVar6->nOp + -1;
                    if (-1 < iVar20) {
                      iVar13 = iVar20;
                    }
                    pOVar23 = local_80->aOp + iVar13;
                  }
                  iVar20 = bVar11 + 3;
                  pOVar23->p2 = pVVar6->nOp;
                }
              }
              local_d0 = local_d0->pNext;
            } while ((local_d0 != (Index *)0x0) && (iVar20 == 0));
            goto LAB_001842fd;
          }
        }
        else {
          puVar30 = &local_c0->nAllField;
          uVar33 = 0;
          do {
            pEVar18 = sqlite3VectorFieldSubexpr(pX->pLeft,(int)uVar33);
            if ((long)*(short *)(*(long *)puVar30 + 0x30) < 0) {
              cVar10 = 'D';
            }
            else {
              cVar10 = pTab->aCol[*(short *)(*(long *)puVar30 + 0x30)].affinity;
            }
            cVar12 = sqlite3CompareAffinity(pEVar18,cVar10);
            bVar34 = (byte)(cVar12 + 0xbfU) < 2;
            uVar33 = uVar33 + 1;
          } while ((uVar33 < uVar25) && (puVar30 = puVar30 + 0x10, 'B' < cVar10 || bVar34));
          if ('B' < cVar10 || bVar34) goto LAB_0018476c;
        }
        iVar20 = 0;
        pParse = local_90;
      }
    }
  }
LAB_001842fd:
  piVar28 = local_78;
  if (((iVar20 == 0) && (iVar20 = 0, (inFlags & 1) != 0)) && ((pX->flags & 0x800) == 0)) {
    pEVar18 = pX->pLeft;
    pX->pLeft = (Expr *)0x0;
    local_68.eCode = '\x01';
    local_68.xExprCallback = exprNodeIsConstant;
    local_68.xSelectCallback = sqlite3SelectWalkFail;
    local_68.u.n = 0;
    if (pX != (Expr *)0x0) {
      walkExpr(&local_68,pX);
    }
    pX->pLeft = pEVar18;
    if ((local_68.eCode == '\0') || (((pX->x).pList)->nExpr < 3)) {
      iVar20 = 5;
    }
  }
  if (iVar20 == 0) {
    uVar3 = pParse->nQueryLoop;
    if ((inFlags & 4) == 0) {
      if (local_a0 == (int *)0x0) goto LAB_00184474;
      iVar20 = pParse->nMem + 1;
      pParse->nMem = iVar20;
      local_98 = CONCAT44(local_98._4_4_,iVar20);
      *local_a0 = iVar20;
    }
    else {
      pParse->nQueryLoop = 0;
LAB_00184474:
      local_98 = (ulong)local_98._4_4_ << 0x20;
    }
    pVVar6 = pParse->pVdbe;
    uVar25 = pX->flags;
    iVar20 = 0;
    if (((uVar25 & 0x20) == 0) && (pParse->iSelfTab == 0)) {
      if ((uVar25 >> 0x19 & 1) == 0) {
        pX->flags = uVar25 | 0x2000000;
        iVar20 = pParse->nMem + 1;
        pParse->nMem = iVar20;
        (pX->y).sub.regReturn = iVar20;
        iVar20 = sqlite3VdbeAddOp3(pVVar6,0x46,0,iVar20,0);
        (pX->y).sub.iAddr = iVar20 + 1;
        iVar20 = sqlite3VdbeAddOp3(pVVar6,0x11,0,0,0);
        goto LAB_001844e4;
      }
      iVar20 = sqlite3VdbeAddOp3(pVVar6,0x11,0,0,0);
      if ((pX->flags & 0x800) != 0) {
        sqlite3VdbeExplain(pParse,'\0',"REUSE LIST SUBQUERY %d",(ulong)((pX->x).pSelect)->selId);
      }
      sqlite3VdbeAddOp3(pVVar6,0xc,(pX->y).sub.regReturn,(pX->y).sub.iAddr,0);
      sqlite3VdbeAddOp3(pVVar6,0x6f,(int)local_b8,pX->iTable,0);
      if (pVVar6->db->mallocFailed == '\0') {
        iVar13 = pVVar6->nOp + -1;
        if (-1 < iVar20) {
          iVar13 = iVar20;
        }
        pOVar23 = pVVar6->aOp + iVar13;
      }
      else {
        pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar23->p2 = pVVar6->nOp;
    }
    else {
LAB_001844e4:
      local_a8 = pX->pLeft;
      uVar9 = local_a8->op;
      if (uVar9 == 0xa8) {
        uVar9 = local_a8->op2;
      }
      if (uVar9 == 0x83) {
        pSVar15 = (local_a8->x).pSelect;
LAB_00184513:
        uVar25 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar15->pEList)->pList->nExpr;
      }
      else {
        uVar25 = 1;
        if (uVar9 == 0xa9) {
          pSVar15 = (Select *)&local_a8->x;
          goto LAB_00184513;
        }
      }
      pX->iTable = (int)local_b8;
      local_b0 = pX;
      iVar13 = sqlite3VdbeAddOp3(pVVar6,0x71,(int)local_b8,uVar25,0);
      local_a0 = (int *)CONCAT44(local_a0._4_4_,iVar13);
      pKVar16 = sqlite3KeyInfoAlloc(pParse->db,uVar25,1);
      pSVar15 = (pX->x).pSelect;
      local_c0 = pKVar16;
      if ((pX->flags & 0x800) == 0) {
        if (pSVar15 != (Select *)0x0) {
          cVar10 = sqlite3ExprAffinity(local_a8);
          local_c1 = 'A';
          if (cVar10 != '\0') {
            local_c1 = cVar10;
          }
          if (pKVar16 != (KeyInfo *)0x0) {
            pCVar17 = sqlite3ExprCollSeq(pParse,local_b0->pLeft);
            pKVar16->aColl[0] = pCVar17;
          }
          if (pParse->nTempReg == '\0') {
            iVar13 = pParse->nMem + 1;
            pParse->nMem = iVar13;
          }
          else {
            bVar11 = pParse->nTempReg - 1;
            pParse->nTempReg = bVar11;
            iVar13 = pParse->aTempReg[bVar11];
          }
          local_a8 = (Expr *)CONCAT44(local_a8._4_4_,iVar13);
          if (pParse->nTempReg == '\0') {
            iVar13 = pParse->nMem + 1;
            pParse->nMem = iVar13;
          }
          else {
            bVar11 = pParse->nTempReg - 1;
            pParse->nTempReg = bVar11;
            iVar13 = pParse->aTempReg[bVar11];
          }
          if (0 < *(int *)&pSVar15->pEList) {
            ppSVar31 = (SrcList **)&pSVar15->op;
            iVar29 = *(int *)&pSVar15->pEList + 1;
            do {
              pSVar8 = *ppSVar31;
              if (iVar20 == 0) {
LAB_00184b29:
                iVar20 = 0;
              }
              else {
                local_68.eCode = '\x01';
                local_68.xExprCallback = exprNodeIsConstant;
                local_68.xSelectCallback = sqlite3SelectWalkFail;
                local_68.u.n = 0;
                if (pSVar8 != (SrcList *)0x0) {
                  walkExpr(&local_68,(Expr *)pSVar8);
                }
                if (local_68.eCode == '\0') {
                  sqlite3VdbeChangeToNoop(pVVar6,iVar20);
                  goto LAB_00184b29;
                }
              }
              iVar14 = sqlite3ExprCodeTarget(pParse,(Expr *)pSVar8,(int)local_a8);
              addr = sqlite3VdbeAddOp3(pVVar6,0x5c,iVar14,1,iVar13);
              sqlite3VdbeChangeP4(pVVar6,addr,&local_c1,1);
              iVar14 = sqlite3VdbeAddOp3(pVVar6,0x84,(int)local_b8,iVar13,iVar14);
              if (pVVar6->db->mallocFailed == '\0') {
                pOVar23 = pVVar6->aOp;
                pOVar23[iVar14].p4type = -3;
                pOVar23[iVar14].p4.i = 1;
              }
              ppSVar31 = ppSVar31 + 4;
              iVar29 = iVar29 + -1;
            } while (1 < iVar29);
          }
          if ((int)local_a8 != 0) {
            bVar11 = pParse->nTempReg;
            if ((ulong)bVar11 < 8) {
              pParse->nTempReg = bVar11 + 1;
              pParse->aTempReg[bVar11] = (int)local_a8;
            }
          }
          piVar28 = local_78;
          if (iVar13 != 0) {
            bVar11 = pParse->nTempReg;
            if ((ulong)bVar11 < 8) {
              pParse->nTempReg = bVar11 + 1;
              pParse->aTempReg[bVar11] = iVar13;
            }
          }
        }
      }
      else {
        pEVar4 = pSVar15->pEList;
        pcVar22 = "";
        if (iVar20 == 0) {
          pcVar22 = "CORRELATED ";
        }
        sqlite3VdbeExplain(pParse,'\x01',"%sLIST SUBQUERY %d",pcVar22);
        if (pEVar4->nExpr == uVar25) {
          local_68.pParse._0_1_ = 0xb;
          local_68.pParse._4_4_ = (undefined4)local_b8;
          local_68.xExprCallback = (_func_int_Walker_ptr_Expr_ptr *)0x0;
          local_68.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
          local_68.xSelectCallback =
               (_func_int_Walker_ptr_Select_ptr *)exprINAffinity(pParse,local_b0);
          pSVar15->iLimit = 0;
          local_90 = pParse;
          iVar13 = sqlite3Select(pParse,pSVar15,(SelectDest *)&local_68);
          local_70 = CONCAT44(local_70._4_4_,iVar13);
          if (iVar13 == 0) {
            if (local_68.xSelectCallback != (_func_int_Walker_ptr_Select_ptr *)0x0) {
              sqlite3DbFreeNN(local_90->db,local_68.xSelectCallback);
            }
            pParse = local_90;
            pEVar18 = local_a8;
            if (0 < (int)uVar25) {
              pEVar27 = pEVar4->a;
              uVar33 = 0;
              do {
                pEVar19 = sqlite3VectorFieldSubexpr(pEVar18,(int)uVar33);
                pCVar17 = sqlite3BinaryCompareCollSeq(pParse,pEVar19,pEVar27->pExpr);
                local_c0->aColl[uVar33] = pCVar17;
                uVar33 = uVar33 + 1;
                pEVar27 = pEVar27 + 1;
              } while (uVar25 != uVar33);
            }
          }
          else {
            if (local_68.xSelectCallback != (_func_int_Walker_ptr_Select_ptr *)0x0) {
              sqlite3DbFreeNN(local_90->db,local_68.xSelectCallback);
            }
            pParse = local_90;
            if ((local_c0 != (KeyInfo *)0x0) &&
               (local_c0->nRef = local_c0->nRef - 1, local_c0->nRef == 0)) {
              sqlite3DbFreeNN(local_c0->db,local_c0);
            }
          }
          pX = local_b0;
          piVar28 = local_78;
          if ((int)local_70 != 0) goto LAB_00184e1e;
        }
      }
      pX = local_b0;
      if (local_c0 != (KeyInfo *)0x0) {
        sqlite3VdbeChangeP4(pVVar6,(int)local_a0,(char *)local_c0,-9);
      }
      if (iVar20 != 0) {
        pOVar32 = (Op *)&sqlite3VdbeGetOp_dummy;
        pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
        if (pVVar6->db->mallocFailed == '\0') {
          iVar13 = pVVar6->nOp + -1;
          if (-1 < iVar20) {
            iVar13 = iVar20;
          }
          pOVar23 = pVVar6->aOp + iVar13;
        }
        pOVar23->p2 = pVVar6->nOp;
        sqlite3VdbeAddOp3(pVVar6,0x42,(pX->y).sub.regReturn,0,0);
        iVar20 = pVVar6->nOp + -1;
        if (pVVar6->db->mallocFailed == '\0') {
          iVar13 = (pX->y).sub.iAddr;
          iVar29 = iVar13 + -1;
          if (iVar13 < 1) {
            iVar29 = iVar20;
          }
          pOVar32 = pVVar6->aOp + iVar29;
        }
        pOVar32->p1 = iVar20;
      }
    }
LAB_00184e1e:
    if ((int)local_98 != 0) {
      sqlite3SetHasNullFlag(local_80,(int)local_b8,(int)local_98);
    }
    pParse->nQueryLoop = uVar3;
    iVar20 = 2;
  }
  if ((piVar28 == (int *)0x0) || (0xfffffffd < iVar20 - 5U)) goto LAB_00184e94;
  pEVar18 = pX->pLeft;
  uVar9 = pEVar18->op;
  if (uVar9 == 0xa8) {
    uVar9 = pEVar18->op2;
  }
  if (uVar9 == 0x83) {
    pSVar15 = (pEVar18->x).pSelect;
LAB_00184e7b:
    uVar25 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar15->pEList)->pList->nExpr;
  }
  else {
    uVar25 = 1;
    if (uVar9 == 0xa9) {
      pSVar15 = (Select *)&pEVar18->x;
      goto LAB_00184e7b;
    }
  }
  if (0 < (int)uVar25) {
    uVar33 = 0;
    do {
      piVar28[uVar33] = (int)uVar33;
      uVar33 = uVar33 + 1;
    } while (uVar25 != uVar33);
  }
LAB_00184e94:
  *local_38 = (int)local_b8;
  return iVar20;
}

Assistant:

SQLITE_PRIVATE int sqlite3FindInIndex(
  Parse *pParse,             /* Parsing context */
  Expr *pX,                  /* The right-hand side (RHS) of the IN operator */
  u32 inFlags,               /* IN_INDEX_LOOP, _MEMBERSHIP, and/or _NOOP_OK */
  int *prRhsHasNull,         /* Register holding NULL status.  See notes */
  int *aiMap,                /* Mapping from Index fields to RHS fields */
  int *piTab                 /* OUT: index to use */
){
  Select *p;                            /* SELECT to the right of IN operator */
  int eType = 0;                        /* Type of RHS table. IN_INDEX_* */
  int iTab = pParse->nTab++;            /* Cursor of the RHS table */
  int mustBeUnique;                     /* True if RHS must be unique */
  Vdbe *v = sqlite3GetVdbe(pParse);     /* Virtual machine being coded */

  assert( pX->op==TK_IN );
  mustBeUnique = (inFlags & IN_INDEX_LOOP)!=0;

  /* If the RHS of this IN(...) operator is a SELECT, and if it matters 
  ** whether or not the SELECT result contains NULL values, check whether
  ** or not NULL is actually possible (it may not be, for example, due 
  ** to NOT NULL constraints in the schema). If no NULL values are possible,
  ** set prRhsHasNull to 0 before continuing.  */
  if( prRhsHasNull && (pX->flags & EP_xIsSelect) ){
    int i;
    ExprList *pEList = pX->x.pSelect->pEList;
    for(i=0; i<pEList->nExpr; i++){
      if( sqlite3ExprCanBeNull(pEList->a[i].pExpr) ) break;
    }
    if( i==pEList->nExpr ){
      prRhsHasNull = 0;
    }
  }

  /* Check to see if an existing table or index can be used to
  ** satisfy the query.  This is preferable to generating a new 
  ** ephemeral table.  */
  if( pParse->nErr==0 && (p = isCandidateForInOpt(pX))!=0 ){
    sqlite3 *db = pParse->db;              /* Database connection */
    Table *pTab;                           /* Table <table>. */
    i16 iDb;                               /* Database idx for pTab */
    ExprList *pEList = p->pEList;
    int nExpr = pEList->nExpr;

    assert( p->pEList!=0 );             /* Because of isCandidateForInOpt(p) */
    assert( p->pEList->a[0].pExpr!=0 ); /* Because of isCandidateForInOpt(p) */
    assert( p->pSrc!=0 );               /* Because of isCandidateForInOpt(p) */
    pTab = p->pSrc->a[0].pTab;

    /* Code an OP_Transaction and OP_TableLock for <table>. */
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    sqlite3CodeVerifySchema(pParse, iDb);
    sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);

    assert(v);  /* sqlite3GetVdbe() has always been previously called */
    if( nExpr==1 && pEList->a[0].pExpr->iColumn<0 ){
      /* The "x IN (SELECT rowid FROM table)" case */
      int iAddr = sqlite3VdbeAddOp0(v, OP_Once);
      VdbeCoverage(v);

      sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
      eType = IN_INDEX_ROWID;
      ExplainQueryPlan((pParse, 0,
            "USING ROWID SEARCH ON TABLE %s FOR IN-OPERATOR",pTab->zName));
      sqlite3VdbeJumpHere(v, iAddr);
    }else{
      Index *pIdx;                         /* Iterator variable */
      int affinity_ok = 1;
      int i;

      /* Check that the affinity that will be used to perform each 
      ** comparison is the same as the affinity of each column in table
      ** on the RHS of the IN operator.  If it not, it is not possible to
      ** use any index of the RHS table.  */
      for(i=0; i<nExpr && affinity_ok; i++){
        Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
        int iCol = pEList->a[i].pExpr->iColumn;
        char idxaff = sqlite3TableColumnAffinity(pTab,iCol); /* RHS table */
        char cmpaff = sqlite3CompareAffinity(pLhs, idxaff);
        testcase( cmpaff==SQLITE_AFF_BLOB );
        testcase( cmpaff==SQLITE_AFF_TEXT );
        switch( cmpaff ){
          case SQLITE_AFF_BLOB:
            break;
          case SQLITE_AFF_TEXT:
            /* sqlite3CompareAffinity() only returns TEXT if one side or the
            ** other has no affinity and the other side is TEXT.  Hence,
            ** the only way for cmpaff to be TEXT is for idxaff to be TEXT
            ** and for the term on the LHS of the IN to have no affinity. */
            assert( idxaff==SQLITE_AFF_TEXT );
            break;
          default:
            affinity_ok = sqlite3IsNumericAffinity(idxaff);
        }
      }

      if( affinity_ok ){
        /* Search for an existing index that will work for this IN operator */
        for(pIdx=pTab->pIndex; pIdx && eType==0; pIdx=pIdx->pNext){
          Bitmask colUsed;      /* Columns of the index used */
          Bitmask mCol;         /* Mask for the current column */
          if( pIdx->nColumn<nExpr ) continue;
          if( pIdx->pPartIdxWhere!=0 ) continue;
          /* Maximum nColumn is BMS-2, not BMS-1, so that we can compute
          ** BITMASK(nExpr) without overflowing */
          testcase( pIdx->nColumn==BMS-2 );
          testcase( pIdx->nColumn==BMS-1 );
          if( pIdx->nColumn>=BMS-1 ) continue;
          if( mustBeUnique ){
            if( pIdx->nKeyCol>nExpr
             ||(pIdx->nColumn>nExpr && !IsUniqueIndex(pIdx))
            ){
              continue;  /* This index is not unique over the IN RHS columns */
            }
          }
  
          colUsed = 0;   /* Columns of index used so far */
          for(i=0; i<nExpr; i++){
            Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
            Expr *pRhs = pEList->a[i].pExpr;
            CollSeq *pReq = sqlite3BinaryCompareCollSeq(pParse, pLhs, pRhs);
            int j;
  
            assert( pReq!=0 || pRhs->iColumn==XN_ROWID || pParse->nErr );
            for(j=0; j<nExpr; j++){
              if( pIdx->aiColumn[j]!=pRhs->iColumn ) continue;
              assert( pIdx->azColl[j] );
              if( pReq!=0 && sqlite3StrICmp(pReq->zName, pIdx->azColl[j])!=0 ){
                continue;
              }
              break;
            }
            if( j==nExpr ) break;
            mCol = MASKBIT(j);
            if( mCol & colUsed ) break; /* Each column used only once */
            colUsed |= mCol;
            if( aiMap ) aiMap[i] = j;
          }
  
          assert( i==nExpr || colUsed!=(MASKBIT(nExpr)-1) );
          if( colUsed==(MASKBIT(nExpr)-1) ){
            /* If we reach this point, that means the index pIdx is usable */
            int iAddr = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
            ExplainQueryPlan((pParse, 0,
                              "USING INDEX %s FOR IN-OPERATOR",pIdx->zName));
            sqlite3VdbeAddOp3(v, OP_OpenRead, iTab, pIdx->tnum, iDb);
            sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
            VdbeComment((v, "%s", pIdx->zName));
            assert( IN_INDEX_INDEX_DESC == IN_INDEX_INDEX_ASC+1 );
            eType = IN_INDEX_INDEX_ASC + pIdx->aSortOrder[0];
  
            if( prRhsHasNull ){
#ifdef SQLITE_ENABLE_COLUMN_USED_MASK
              i64 mask = (1<<nExpr)-1;
              sqlite3VdbeAddOp4Dup8(v, OP_ColumnsUsed, 
                  iTab, 0, 0, (u8*)&mask, P4_INT64);
#endif
              *prRhsHasNull = ++pParse->nMem;
              if( nExpr==1 ){
                sqlite3SetHasNullFlag(v, iTab, *prRhsHasNull);
              }
            }
            sqlite3VdbeJumpHere(v, iAddr);
          }
        } /* End loop over indexes */
      } /* End if( affinity_ok ) */
    } /* End if not an rowid index */
  } /* End attempt to optimize using an index */

  /* If no preexisting index is available for the IN clause
  ** and IN_INDEX_NOOP is an allowed reply
  ** and the RHS of the IN operator is a list, not a subquery
  ** and the RHS is not constant or has two or fewer terms,
  ** then it is not worth creating an ephemeral table to evaluate
  ** the IN operator so return IN_INDEX_NOOP.
  */
  if( eType==0
   && (inFlags & IN_INDEX_NOOP_OK)
   && !ExprHasProperty(pX, EP_xIsSelect)
   && (!sqlite3InRhsIsConstant(pX) || pX->x.pList->nExpr<=2)
  ){
    eType = IN_INDEX_NOOP;
  }

  if( eType==0 ){
    /* Could not find an existing table or index to use as the RHS b-tree.
    ** We will have to generate an ephemeral table to do the job.
    */
    u32 savedNQueryLoop = pParse->nQueryLoop;
    int rMayHaveNull = 0;
    eType = IN_INDEX_EPH;
    if( inFlags & IN_INDEX_LOOP ){
      pParse->nQueryLoop = 0;
    }else if( prRhsHasNull ){
      *prRhsHasNull = rMayHaveNull = ++pParse->nMem;
    }
    assert( pX->op==TK_IN );
    sqlite3CodeRhsOfIN(pParse, pX, iTab);
    if( rMayHaveNull ){
      sqlite3SetHasNullFlag(v, iTab, rMayHaveNull);
    }
    pParse->nQueryLoop = savedNQueryLoop;
  }

  if( aiMap && eType!=IN_INDEX_INDEX_ASC && eType!=IN_INDEX_INDEX_DESC ){
    int i, n;
    n = sqlite3ExprVectorSize(pX->pLeft);
    for(i=0; i<n; i++) aiMap[i] = i;
  }
  *piTab = iTab;
  return eType;
}